

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O2

void __thiscall charls::jpeg_stream_reader::read_start_of_scan_segment(jpeg_stream_reader *this)

{
  byte bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  check_minimal_segment_size(this,1);
  bVar1 = read_byte(this);
  if (0xfb < (byte)(bVar1 - 5)) {
    uVar5 = (ulong)bVar1;
    uVar4 = (ulong)(this->frame_info_).component_count;
    if (uVar5 <= uVar4) {
      if (uVar5 == uVar4 || bVar1 == 1) {
        check_segment_size(this,uVar5 * 2 + 4);
        lVar6 = uVar5 + 1;
        do {
          lVar6 = lVar6 + -1;
          if (lVar6 == 0) {
            bVar1 = read_byte(this);
            (this->parameters_).near_lossless = (uint)bVar1;
            uVar3 = maximum_sample_value(this);
            if ((int)uVar3 / 2 < (int)(uint)bVar1) {
              impl::throw_jpegls_error(invalid_parameter_near_lossless);
            }
            bVar1 = read_byte(this);
            check_interleave_mode(this,(uint)bVar1);
            (this->parameters_).interleave_mode = (uint)bVar1;
            bVar1 = read_byte(this);
            if ((bVar1 & 0xf) == 0) {
              this->state_ = bit_stream_section;
              return;
            }
            break;
          }
          skip_byte(this);
          uVar2 = read_byte(this);
        } while (uVar2 == '\0');
      }
      impl::throw_jpegls_error(ParameterValueNotSupported);
    }
  }
  impl::throw_jpegls_error(invalid_parameter_component_count);
}

Assistant:

void jpeg_stream_reader::read_start_of_scan_segment()
{
    check_minimal_segment_size(1);
    const size_t component_count_in_scan{read_uint8()};

    // ISO 10918-1, B2.3. defines the limits for the number of image components parameter in a SOS.
    if (UNLIKELY(component_count_in_scan < 1U || component_count_in_scan > 4U ||
                 component_count_in_scan > static_cast<size_t>(frame_info_.component_count)))
        throw_jpegls_error(jpegls_errc::invalid_parameter_component_count);

    if (UNLIKELY(component_count_in_scan != 1 &&
                 component_count_in_scan != static_cast<size_t>(frame_info_.component_count)))
        throw_jpegls_error(jpegls_errc::parameter_value_not_supported);

    check_segment_size((component_count_in_scan * 2) + 4);

    for (size_t i{}; i != component_count_in_scan; ++i)
    {
        skip_byte(); // Skip scan component selector
        const uint8_t mapping_table_selector{read_uint8()};
        if (UNLIKELY(mapping_table_selector != 0))
            throw_jpegls_error(jpegls_errc::parameter_value_not_supported);
    }

    parameters_.near_lossless = read_uint8(); // Read NEAR parameter
    if (UNLIKELY(parameters_.near_lossless > compute_maximum_near_lossless(static_cast<int>(maximum_sample_value()))))
        throw_jpegls_error(jpegls_errc::invalid_parameter_near_lossless);

    const auto mode{static_cast<interleave_mode>(read_byte())}; // Read ILV parameter
    check_interleave_mode(mode);
    parameters_.interleave_mode = mode;

    if (UNLIKELY((read_byte() & 0xFU) != 0)) // Read Ah (no meaning) and Al (point transform).
        throw_jpegls_error(jpegls_errc::parameter_value_not_supported);

    state_ = state::bit_stream_section;
}